

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filteredbrk.cpp
# Opt level: O0

EFBMatchResult __thiscall
icu_63::SimpleFilteredSentenceBreakIterator::breakExceptionAt
          (SimpleFilteredSentenceBreakIterator *this,int32_t n)

{
  UBool UVar1;
  UChar32 UVar2;
  UText *pUVar3;
  UCharsTrie *pUVar4;
  bool bVar5;
  UStringTrieResult local_38;
  UStringTrieResult local_34;
  UStringTrieResult rfwd;
  UStringTrieResult r;
  UChar32 uch;
  int32_t bestValue;
  int64_t bestPosn;
  int32_t n_local;
  SimpleFilteredSentenceBreakIterator *this_local;
  
  _uch = -1;
  r = ~USTRINGTRIE_NO_MATCH;
  pUVar3 = LocalPointerBase<UText>::getAlias(&(this->fText).super_LocalPointerBase<UText>);
  utext_setNativeIndex_63(pUVar3,(long)n);
  pUVar4 = LocalPointerBase<icu_63::UCharsTrie>::operator->
                     (&(this->fData->fBackwardsTrie).super_LocalPointerBase<icu_63::UCharsTrie>);
  UCharsTrie::reset(pUVar4);
  pUVar3 = LocalPointerBase<UText>::getAlias(&(this->fText).super_LocalPointerBase<UText>);
  UVar2 = utext_previous32_63(pUVar3);
  if (UVar2 != 0x20) {
    pUVar3 = LocalPointerBase<UText>::getAlias(&(this->fText).super_LocalPointerBase<UText>);
    utext_next32_63(pUVar3);
  }
  local_34 = USTRINGTRIE_INTERMEDIATE_VALUE;
  while( true ) {
    pUVar3 = LocalPointerBase<UText>::getAlias(&(this->fText).super_LocalPointerBase<UText>);
    UVar2 = utext_previous32_63(pUVar3);
    bVar5 = false;
    if (UVar2 != -1) {
      pUVar4 = LocalPointerBase<icu_63::UCharsTrie>::operator->
                         (&(this->fData->fBackwardsTrie).super_LocalPointerBase<icu_63::UCharsTrie>)
      ;
      local_34 = UCharsTrie::nextForCodePoint(pUVar4,UVar2);
      bVar5 = (local_34 & USTRINGTRIE_NO_VALUE) != USTRINGTRIE_NO_MATCH;
    }
    if (!bVar5) break;
    if (1 < (int)local_34) {
      pUVar3 = LocalPointerBase<UText>::getAlias(&(this->fText).super_LocalPointerBase<UText>);
      _uch = utext_getNativeIndex_63(pUVar3);
      pUVar4 = LocalPointerBase<icu_63::UCharsTrie>::operator->
                         (&(this->fData->fBackwardsTrie).super_LocalPointerBase<icu_63::UCharsTrie>)
      ;
      r = UCharsTrie::getValue(pUVar4);
    }
  }
  if (local_34 != USTRINGTRIE_NO_MATCH) {
    pUVar4 = LocalPointerBase<icu_63::UCharsTrie>::operator->
                       (&(this->fData->fBackwardsTrie).super_LocalPointerBase<icu_63::UCharsTrie>);
    r = UCharsTrie::getValue(pUVar4);
    pUVar3 = LocalPointerBase<UText>::getAlias(&(this->fText).super_LocalPointerBase<UText>);
    _uch = utext_getNativeIndex_63(pUVar3);
  }
  if (_uch < 0) {
    this_local._4_4_ = kNoExceptionHere;
  }
  else if (r == USTRINGTRIE_FINAL_VALUE) {
    this_local._4_4_ = kExceptionHere;
  }
  else if ((r == USTRINGTRIE_NO_VALUE) &&
          (UVar1 = LocalPointerBase<icu_63::UCharsTrie>::isValid
                             (&(this->fData->fForwardsPartialTrie).
                               super_LocalPointerBase<icu_63::UCharsTrie>), UVar1 != '\0')) {
    pUVar4 = LocalPointerBase<icu_63::UCharsTrie>::operator->
                       (&(this->fData->fForwardsPartialTrie).
                         super_LocalPointerBase<icu_63::UCharsTrie>);
    UCharsTrie::reset(pUVar4);
    local_38 = USTRINGTRIE_INTERMEDIATE_VALUE;
    pUVar3 = LocalPointerBase<UText>::getAlias(&(this->fText).super_LocalPointerBase<UText>);
    utext_setNativeIndex_63(pUVar3,_uch);
    do {
      pUVar3 = LocalPointerBase<UText>::getAlias(&(this->fText).super_LocalPointerBase<UText>);
      UVar2 = utext_next32_63(pUVar3);
      bVar5 = false;
      if (UVar2 != -1) {
        pUVar4 = LocalPointerBase<icu_63::UCharsTrie>::operator->
                           (&(this->fData->fForwardsPartialTrie).
                             super_LocalPointerBase<icu_63::UCharsTrie>);
        local_38 = UCharsTrie::nextForCodePoint(pUVar4,UVar2);
        bVar5 = (local_38 & USTRINGTRIE_NO_VALUE) != USTRINGTRIE_NO_MATCH;
      }
    } while (bVar5);
    if (local_38 == USTRINGTRIE_NO_MATCH) {
      this_local._4_4_ = kNoExceptionHere;
    }
    else {
      this_local._4_4_ = kExceptionHere;
    }
  }
  else {
    this_local._4_4_ = kNoExceptionHere;
  }
  return this_local._4_4_;
}

Assistant:

SimpleFilteredSentenceBreakIterator::EFBMatchResult
SimpleFilteredSentenceBreakIterator::breakExceptionAt(int32_t n) {
    int64_t bestPosn = -1;
    int32_t bestValue = -1;
    // loops while 'n' points to an exception.
    utext_setNativeIndex(fText.getAlias(), n); // from n..
    fData->fBackwardsTrie->reset();
    UChar32 uch;

    //if(debug2) u_printf(" n@ %d\n", n);
    // Assume a space is following the '.'  (so we handle the case:  "Mr. /Brown")
    if((uch=utext_previous32(fText.getAlias()))==(UChar32)0x0020) {  // TODO: skip a class of chars here??
      // TODO only do this the 1st time?
      //if(debug2) u_printf("skipping prev: |%C| \n", (UChar)uch);
    } else {
      //if(debug2) u_printf("not skipping prev: |%C| \n", (UChar)uch);
      uch = utext_next32(fText.getAlias());
      //if(debug2) u_printf(" -> : |%C| \n", (UChar)uch);
    }

    UStringTrieResult r = USTRINGTRIE_INTERMEDIATE_VALUE;

    while((uch=utext_previous32(fText.getAlias()))!=U_SENTINEL  &&   // more to consume backwards and..
          USTRINGTRIE_HAS_NEXT(r=fData->fBackwardsTrie->nextForCodePoint(uch))) {// more in the trie
      if(USTRINGTRIE_HAS_VALUE(r)) { // remember the best match so far
        bestPosn = utext_getNativeIndex(fText.getAlias());
        bestValue = fData->fBackwardsTrie->getValue();
      }
      //if(debug2) u_printf("rev< /%C/ cont?%d @%d\n", (UChar)uch, r, utext_getNativeIndex(fText.getAlias()));
    }

    if(USTRINGTRIE_MATCHES(r)) { // exact match?
      //if(debug2) u_printf("rev<?/%C/?end of seq.. r=%d, bestPosn=%d, bestValue=%d\n", (UChar)uch, r, bestPosn, bestValue);
      bestValue = fData->fBackwardsTrie->getValue();
      bestPosn = utext_getNativeIndex(fText.getAlias());
      //if(debug2) u_printf("rev<+/%C/+end of seq.. r=%d, bestPosn=%d, bestValue=%d\n", (UChar)uch, r, bestPosn, bestValue);
    }

    if(bestPosn>=0) {
      //if(debug2) u_printf("rev< /%C/ end of seq.. r=%d, bestPosn=%d, bestValue=%d\n", (UChar)uch, r, bestPosn, bestValue);

      //if(USTRINGTRIE_MATCHES(r)) {  // matched - so, now what?
      //int32_t bestValue = fBackwardsTrie->getValue();
      ////if(debug2) u_printf("rev< /%C/ matched, skip..%d  bestValue=%d\n", (UChar)uch, r, bestValue);

      if(bestValue == kMATCH) { // exact match!
        //if(debug2) u_printf(" exact backward match\n");
        return kExceptionHere; // See if the next is another exception.
      } else if(bestValue == kPARTIAL
                && fData->fForwardsPartialTrie.isValid()) { // make sure there's a forward trie
        //if(debug2) u_printf(" partial backward match\n");
        // We matched the "Ph." in "Ph.D." - now we need to run everything through the forwards trie
        // to see if it matches something going forward.
        fData->fForwardsPartialTrie->reset();
        UStringTrieResult rfwd = USTRINGTRIE_INTERMEDIATE_VALUE;
        utext_setNativeIndex(fText.getAlias(), bestPosn); // hope that's close ..
        //if(debug2) u_printf("Retrying at %d\n", bestPosn);
        while((uch=utext_next32(fText.getAlias()))!=U_SENTINEL &&
              USTRINGTRIE_HAS_NEXT(rfwd=fData->fForwardsPartialTrie->nextForCodePoint(uch))) {
          //if(debug2) u_printf("fwd> /%C/ cont?%d @%d\n", (UChar)uch, rfwd, utext_getNativeIndex(fText.getAlias()));
        }
        if(USTRINGTRIE_MATCHES(rfwd)) {
          //if(debug2) u_printf("fwd> /%C/ == forward match!\n", (UChar)uch);
          // only full matches here, nothing to check
          // skip the next:
            return kExceptionHere;
        } else {
          //if(debug2) u_printf("fwd> /%C/ no match.\n", (UChar)uch);
          // no match (no exception) -return the 'underlying' break
          return kNoExceptionHere;
        }
      } else {
        return kNoExceptionHere; // internal error and/or no forwards trie
      }
    } else {
      //if(debug2) u_printf("rev< /%C/ .. no match..%d\n", (UChar)uch, r);  // no best match
      return kNoExceptionHere; // No match - so exit. Not an exception.
    }
}